

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeMRRC2(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  DecodeStatus DVar2;
  undefined1 uVar3;
  undefined7 uVar4;
  uint64_t Address_00;
  uint64_t Address_01;
  uint RegNo;
  uint RegNo_00;
  undefined1 uVar5;
  
  uVar3 = SUB81(Decoder,0);
  uVar4 = (undefined7)((ulong)Decoder >> 8);
  DVar1 = MCDisassembler_Fail;
  if ((Val & 0xe00) != 0xa00) {
    RegNo_00 = Val >> 0x10 & 0xf;
    RegNo = Val >> 0xc & 0xf;
    uVar5 = RegNo != RegNo_00;
    MCOperand_CreateImm0(Inst,(ulong)(Val >> 8 & 0xf));
    MCOperand_CreateImm0(Inst,(ulong)(Val >> 4 & 0xf));
    DVar1 = DecodeGPRnopcRegisterClass(Inst,RegNo,Address_00,(void *)CONCAT71(uVar4,uVar3));
    if (DVar1 == MCDisassembler_Success) {
      DVar1 = (uint)(byte)uVar5 * 2 + MCDisassembler_SoftFail;
    }
    else {
      if (DVar1 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar1 = MCDisassembler_SoftFail;
      uVar5 = uVar3;
    }
    DVar2 = DecodeGPRnopcRegisterClass(Inst,RegNo_00,Address_01,(void *)CONCAT71(uVar4,uVar5));
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar1 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)(Val & 0xf));
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeMRRC2(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{

	DecodeStatus S = MCDisassembler_Success;

	unsigned CRm = fieldFromInstruction_4(Val, 0, 4);
	unsigned opc1 = fieldFromInstruction_4(Val, 4, 4);
	unsigned cop = fieldFromInstruction_4(Val, 8, 4);
	unsigned Rt = fieldFromInstruction_4(Val, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Val, 16, 4);

	if ((cop & ~0x1) == 0xa)
		return MCDisassembler_Fail;

	if (Rt == Rt2)
		S = MCDisassembler_SoftFail;

	MCOperand_CreateImm0(Inst, cop);
	MCOperand_CreateImm0(Inst, opc1);
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, CRm);

	return S;
}